

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

ssize_t zt_cstr_find(char *s,ssize_t i,ssize_t j,char *str)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ssize_t sVar6;
  
  sVar2 = strlen(s);
  if (sVar2 == 0) {
    lVar3 = 0;
    lVar4 = 0;
  }
  else {
    if (i < 0) {
      lVar5 = sVar2 - 1;
      if ((long)(i + sVar2) < (long)sVar2) {
        lVar5 = i + sVar2;
      }
    }
    else {
      lVar5 = sVar2 - 1;
      if (i < (long)sVar2) {
        lVar5 = i;
      }
    }
    if (j < 0) {
      lVar4 = sVar2 - 1;
      if ((long)(j + sVar2) < (long)sVar2) {
        lVar4 = j + sVar2;
      }
    }
    else {
      lVar4 = sVar2 - 1;
      if (j < (long)sVar2) {
        lVar4 = j;
      }
    }
    lVar3 = lVar4;
    if (lVar4 < lVar5) {
      lVar3 = lVar5;
    }
    if (lVar5 < lVar4) {
      lVar4 = lVar5;
    }
  }
  sVar2 = strlen(str);
  sVar6 = -1;
  if (sVar2 != 0) {
    lVar5 = lVar4;
    if ((sVar2 == 1) && (lVar4 <= lVar3)) {
      lVar5 = lVar3 + 1;
      do {
        if (s[lVar4] == *str) {
          return lVar4;
        }
        lVar4 = lVar4 + 1;
      } while (lVar5 != lVar4);
    }
    lVar4 = sVar2 + lVar5;
    while ((sVar6 = -1, lVar4 <= lVar3 + 1 &&
           (iVar1 = strncmp(s + lVar5,str,sVar2), sVar6 = lVar5, iVar1 != 0))) {
      lVar4 = sVar2 + lVar5 + 1;
      lVar5 = lVar5 + 1;
    }
  }
  return sVar6;
}

Assistant:

ssize_t
zt_cstr_find(const char *s, ssize_t i, ssize_t j, const char *str) {
    size_t    len;

    CONVERT(s, i, j);
    zt_assert(str);

    len = strlen(str);

    if (len == 0) {
        return -1;
    } else if (len == 1) {
        for (; i <= j; i++) {
            if (s[i] == *str) {
                return i;
            }
        }
    }

    for (; (ssize_t)(i + len) <= (j + 1); i++) {
        if (strncmp(&s[i], str, len) == 0) {
            return i;
        }
    }

    return -1;
}